

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgmesh.cpp
# Opt level: O3

void __thiscall
TPZGeoMesh::BuildElementsAroundNode
          (TPZGeoMesh *this,int64_t currentnode,
          map<long,_TPZGeoEl_*,_std::less<long>,_std::allocator<std::pair<const_long,_TPZGeoEl_*>_>_>
          *elmap)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  mapped_type pTVar3;
  int iVar4;
  int iVar5;
  _Base_ptr p_Var6;
  long lVar7;
  mapped_type *ppTVar8;
  _Base_ptr p_Var9;
  _Base_ptr p_Var10;
  int iVar11;
  _Self __tmp;
  ulong uVar12;
  TPZGeoElSide neigh;
  _Base_ptr local_58;
  long local_50;
  undefined1 local_48 [8];
  mapped_type local_40;
  int local_38;
  
  local_58 = (elmap->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(elmap->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)local_58 != p_Var1) {
    do {
      p_Var2 = local_58[1]._M_parent;
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(local_58);
      iVar4 = (**(code **)(*(long *)p_Var2 + 0x90))(p_Var2);
      uVar12 = 0;
      if (iVar4 < 1) {
LAB_010fc020:
        if (uVar12 == (long)iVar4) goto LAB_010fc025;
      }
      else {
        do {
          lVar7 = (**(code **)(*(long *)p_Var2 + 0xa8))(p_Var2,uVar12 & 0xffffffff);
          if (lVar7 == currentnode) goto LAB_010fc020;
          uVar12 = uVar12 + 1;
        } while ((long)iVar4 != uVar12);
LAB_010fc025:
        std::
        _Rb_tree<long,std::pair<long_const,TPZGeoEl*>,std::_Select1st<std::pair<long_const,TPZGeoEl*>>,std::less<long>,std::allocator<std::pair<long_const,TPZGeoEl*>>>
        ::erase_abi_cxx11_((_Rb_tree<long,std::pair<long_const,TPZGeoEl*>,std::_Select1st<std::pair<long_const,TPZGeoEl*>>,std::less<long>,std::allocator<std::pair<long_const,TPZGeoEl*>>>
                            *)elmap,(iterator)local_58);
      }
      local_58 = p_Var6;
    } while ((_Rb_tree_header *)p_Var6 != p_Var1);
    local_58 = (elmap->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  }
  if ((_Rb_tree_header *)local_58 != p_Var1) {
    do {
      p_Var2 = local_58[1]._M_parent;
      local_58 = (_Base_ptr)std::_Rb_tree_increment(local_58);
      iVar4 = (**(code **)(*(long *)p_Var2 + 0xf0))(p_Var2);
      if (0 < iVar4) {
        iVar11 = 0;
        do {
          (**(code **)(*(long *)p_Var2 + 0x188))(local_48,p_Var2,iVar11);
          if (((local_40 != (mapped_type)0x0) && (-1 < local_38)) &&
             (iVar5 = (**(code **)(*(long *)local_40 + 0x90))(), 0 < iVar5)) {
            uVar12 = 0;
            while (lVar7 = (**(code **)(*(long *)local_40 + 0xa8))(local_40,uVar12 & 0xffffffff),
                  pTVar3 = local_40, lVar7 != currentnode) {
              uVar12 = uVar12 + 1;
              if ((long)iVar5 == uVar12) goto LAB_010fc154;
            }
            lVar7 = local_40->fId;
            p_Var9 = (elmap->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
            p_Var10 = &p_Var1->_M_header;
            if (p_Var9 == (_Base_ptr)0x0) goto LAB_010fc12d;
            do {
              if (lVar7 <= (long)*(size_t *)(p_Var9 + 1)) {
                p_Var10 = p_Var9;
              }
              p_Var9 = (&p_Var9->_M_left)[(long)*(size_t *)(p_Var9 + 1) < lVar7];
            } while (p_Var9 != (_Base_ptr)0x0);
            if (((_Rb_tree_header *)p_Var10 == p_Var1) ||
               (lVar7 < (long)((_Rb_tree_header *)p_Var10)->_M_node_count)) {
LAB_010fc12d:
              local_50 = lVar7;
              ppTVar8 = std::
                        map<long,_TPZGeoEl_*,_std::less<long>,_std::allocator<std::pair<const_long,_TPZGeoEl_*>_>_>
                        ::operator[](elmap,&local_50);
              *ppTVar8 = pTVar3;
              local_58 = (elmap->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
            }
          }
LAB_010fc154:
          iVar11 = iVar11 + 1;
        } while (iVar11 != iVar4);
      }
    } while ((_Rb_tree_header *)local_58 != p_Var1);
  }
  return;
}

Assistant:

void TPZGeoMesh::BuildElementsAroundNode(int64_t currentnode,map<int64_t,TPZGeoEl*> &elmap)
{
	// first eliminate all elements which do not contain currentnode
	//TPZPix iel = elmap.First();
	map<int64_t, TPZGeoEl *>::iterator ielprev,iel=elmap.begin();
	TPZGeoEl *el;
	int64_t i;
	while(iel!=elmap.end())
	{
		el = iel->second;
		ielprev=iel;
		iel++;//elmap.Next(iel);
		int numnode = el->NNodes();
		for(i=0; i< numnode; i++)
		{
			if(el->NodeIndex(i) == currentnode) break;
		}
		if(i == numnode)
		{
			elmap.erase(ielprev);
		}
	}
	iel = elmap.begin();
	while(iel!=elmap.end())
	{
		el = iel->second;//elmap.Contents(iel);
		iel++;//elmap.Next(iel);
		int nside = el->NSides();
		for(int is=0; is<nside; is++)
		{
			TPZGeoElSide neigh = el->Neighbour(is);
			if(!neigh.Exists()) continue;
			int numnode = neigh.Element()->NNodes();
			for(i=0; i< numnode; i++)
			{
				if(neigh.Element()->NodeIndex(i) == currentnode)
				{
					if(elmap.find(neigh.Element()->Id())==elmap.end())
					{
						// this should be implemented as a stack, so that we dont have to
						// go through the list again each time
						elmap[neigh.Element()->Id()] = neigh.Element();
						iel = elmap.begin();
					}
					break;	// get out of the loop over the nodes
				}
			}
		}
	}
}